

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shape.cpp
# Opt level: O2

void __thiscall sf::Shape::setTexture(Shape *this,Texture *texture,bool resetRect)

{
  bool bVar1;
  Vector2u VVar2;
  Vector2u VVar3;
  Rect<int> local_28;
  
  if (texture == (Texture *)0x0) goto LAB_0015de3e;
  if (!resetRect) {
    if (this->m_texture != (Texture *)0x0) goto LAB_0015de3e;
    local_28.left = 0;
    local_28.top = 0;
    local_28.width = 0;
    local_28.height = 0;
    bVar1 = operator==(&this->m_textureRect,&local_28);
    if (!bVar1) goto LAB_0015de3e;
  }
  VVar2 = Texture::getSize(texture);
  VVar3 = Texture::getSize(texture);
  (this->m_textureRect).left = 0;
  (this->m_textureRect).top = 0;
  (this->m_textureRect).width = VVar2.x;
  (this->m_textureRect).height = VVar3.y;
  updateTexCoords(this);
LAB_0015de3e:
  this->m_texture = texture;
  return;
}

Assistant:

void Shape::setTexture(const Texture* texture, bool resetRect)
{
    if (texture)
    {
        // Recompute the texture area if requested, or if there was no texture & rect before
        if (resetRect || (!m_texture && (m_textureRect == IntRect())))
            setTextureRect(IntRect(0, 0, static_cast<int>(texture->getSize().x), static_cast<int>(texture->getSize().y)));
    }

    // Assign the new texture
    m_texture = texture;
}